

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O1

void re2::hashword2(uint32 *k,size_t length,uint32 *pc,uint32 *pb)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  
  uVar1 = *pc + (int)length * 4 + 0xdeadbeef;
  uVar2 = *pb + uVar1;
  uVar5 = uVar1;
  if (3 < length) {
    do {
      uVar2 = uVar2 + k[2];
      uVar5 = (uVar2 * 0x10 | uVar2 >> 0x1c) ^ (uVar5 + *k) - uVar2;
      iVar3 = uVar2 + uVar1 + k[1];
      uVar2 = (uVar5 << 6 | uVar5 >> 0x1a) ^ (uVar1 + k[1]) - uVar5;
      iVar6 = uVar5 + iVar3;
      uVar1 = (uVar2 << 8 | uVar2 >> 0x18) ^ iVar3 - uVar2;
      iVar7 = uVar2 + iVar6;
      uVar5 = (uVar1 << 0x10 | uVar1 >> 0x10) ^ iVar6 - uVar1;
      iVar3 = uVar1 + iVar7;
      uVar1 = (uVar5 << 0x13 | uVar5 >> 0xd) ^ iVar7 - uVar5;
      uVar5 = uVar5 + iVar3;
      uVar2 = (uVar1 << 4 | uVar1 >> 0x1c) ^ iVar3 - uVar1;
      uVar1 = uVar1 + uVar5;
      length = length - 3;
      k = k + 3;
    } while (3 < length);
  }
  switch(length) {
  case 3:
    uVar2 = uVar2 + k[2];
  case 2:
    uVar1 = uVar1 + k[1];
  case 1:
    uVar2 = (uVar2 ^ uVar1) - (uVar1 << 0xe | uVar1 >> 0x12);
    uVar4 = (uVar5 + *k ^ uVar2) - (uVar2 * 0x800 | uVar2 >> 0x15);
    uVar5 = (uVar1 ^ uVar4) - (uVar4 * 0x2000000 | uVar4 >> 7);
    uVar2 = (uVar2 ^ uVar5) - (uVar5 * 0x10000 | uVar5 >> 0x10);
    uVar1 = (uVar4 ^ uVar2) - (uVar2 * 0x10 | uVar2 >> 0x1c);
    uVar1 = (uVar5 ^ uVar1) - (uVar1 * 0x4000 | uVar1 >> 0x12);
    uVar2 = (uVar2 ^ uVar1) - (uVar1 * 0x1000000 | uVar1 >> 8);
  case 0:
    *pc = uVar2;
    *pb = uVar1;
    return;
  }
}

Assistant:

void hashword2 (
const uint32 *k,                   /* the key, an array of uint32_t values */
size_t          length,               /* the length of the key, in uint32_ts */
uint32       *pc,                      /* IN: seed OUT: primary hash value */
uint32       *pb)               /* IN: more seed OUT: secondary hash value */
{
  uint32_t a,b,c;

  /* Set up the internal state */
  a = b = c = 0xdeadbeef + ((uint32_t)(length<<2)) + *pc;
  c += *pb;

  /*------------------------------------------------- handle most of the key */
  while (length > 3)
  {
    a += k[0];
    b += k[1];
    c += k[2];
    mix(a,b,c);
    length -= 3;
    k += 3;
  }

  /*------------------------------------------- handle the last 3 uint32_t's */
  switch(length)                     /* all the case statements fall through */
  { 
  case 3 : c+=k[2];
  case 2 : b+=k[1];
  case 1 : a+=k[0];
    final(a,b,c);
  case 0:     /* case 0: nothing left to add */
    break;
  }
  /*------------------------------------------------------ report the result */
  *pc=c; *pb=b;
}